

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O3

uint32_t * FastPForLib::__fastpackwithoutmask19_16(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  uint32_t uVar3;
  uint uVar4;
  uint32_t uVar5;
  
  uVar1 = in[1];
  uVar2 = in[3];
  uVar3 = in[4];
  *out = uVar1 << 0x13 | *in;
  uVar4 = in[5];
  out[1] = uVar2 << 0x19 | in[2] << 6 | uVar1 >> 0xd;
  uVar1 = in[6];
  out[2] = uVar4 << 0x1f | uVar3 << 0xc | uVar2 >> 7;
  uVar3 = in[7];
  out[3] = uVar1 << 0x12 | uVar4 >> 1;
  uVar2 = in[8];
  uVar5 = in[9];
  uVar4 = in[10];
  out[4] = uVar2 << 0x18 | uVar3 << 5 | uVar1 >> 0xe;
  uVar1 = in[0xb];
  out[5] = uVar4 << 0x1e | uVar5 << 0xb | uVar2 >> 8;
  uVar3 = in[0xc];
  out[6] = uVar1 << 0x11 | uVar4 >> 2;
  uVar2 = in[0xd];
  uVar5 = in[0xe];
  uVar4 = in[0xf];
  out[7] = uVar2 << 0x17 | uVar3 << 4 | uVar1 >> 0xf;
  out[8] = uVar4 << 0x1d | uVar5 << 10 | uVar2 >> 9;
  out[9] = uVar4 >> 3;
  return out + 10;
}

Assistant:

uint32_t *__fastpackwithoutmask19_16(const uint32_t *__restrict__ in,
                                     uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 19;
  ++out;
  *out = ((*in)) >> (19 - 6);
  ++in;
  *out |= ((*in)) << 6;
  ++in;
  *out |= ((*in)) << 25;
  ++out;
  *out = ((*in)) >> (19 - 12);
  ++in;
  *out |= ((*in)) << 12;
  ++in;
  *out |= ((*in)) << 31;
  ++out;
  *out = ((*in)) >> (19 - 18);
  ++in;
  *out |= ((*in)) << 18;
  ++out;
  *out = ((*in)) >> (19 - 5);
  ++in;
  *out |= ((*in)) << 5;
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (19 - 11);
  ++in;
  *out |= ((*in)) << 11;
  ++in;
  *out |= ((*in)) << 30;
  ++out;
  *out = ((*in)) >> (19 - 17);
  ++in;
  *out |= ((*in)) << 17;
  ++out;
  *out = ((*in)) >> (19 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 23;
  ++out;
  *out = ((*in)) >> (19 - 10);
  ++in;
  *out |= ((*in)) << 10;
  ++in;
  *out |= ((*in)) << 29;
  ++out;
  *out = ((*in)) >> (19 - 16);
  ++in;

  return out + 1;
}